

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::ChLinkLock(ChLinkLock *this)

{
  ChLinkMarkers::ChLinkMarkers(&this->super_ChLinkMarkers);
  (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLinkLock_00b16600;
  this->type = FREE;
  ChLinkMaskLF::ChLinkMaskLF(&this->mask);
  this->ndoc = 0;
  this->ndoc_c = 0;
  this->ndoc_d = 0;
  (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->C_dt).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->C_dtdt).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Cq1).super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows = 0;
  (this->Cq2).super_PlainObjectBase<Eigen::Matrix<double,__1,_7,_1,_7,_7>_>.m_storage.m_rows = 0;
  (this->Cqw1).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>.m_storage.m_rows = 0;
  (this->Cqw2).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_1,_7,_6>_>.m_storage.m_rows = 0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Ct).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->react).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>_>.m_storage.m_rows = 0;
  (this->Ct_temp).pos.m_data[2] = 0.0;
  (this->Ct_temp).pos.m_data[0] = 0.0;
  (this->Ct_temp).pos.m_data[1] = 0.0;
  (this->force_D)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_R)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_X)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Y)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Z)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Rx)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Ry)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  (this->force_Rz)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkForce,_std::default_delete<chrono::ChLinkForce>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkForce_*,_std::default_delete<chrono::ChLinkForce>_>.
  super__Head_base<0UL,_chrono::ChLinkForce_*,_false>._M_head_impl = (ChLinkForce *)0x0;
  this->d_restlength = 0.0;
  (this->limit_X)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Y)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Z)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rx)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Ry)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rz)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_Rp)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->limit_D)._M_t.
  super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>._M_t.
  super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
  super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl = (ChLinkLimit *)0x0;
  (this->Ct_temp).rot.m_data[0] = 1.0;
  (this->Ct_temp).rot.m_data[1] = 0.0;
  (this->Ct_temp).rot.m_data[2] = 0.0;
  (this->Ct_temp).rot.m_data[3] = 0.0;
  memset(&this->Cq1_temp,0,0x310);
  return;
}

Assistant:

ChLinkLock::ChLinkLock() : type(LinkType::FREE), ndoc(0), ndoc_c(0), ndoc_d(0), d_restlength(0) {
    // Need to zero out the bottom-right 4x3 block
    Cq1_temp.setZero();
    Cq2_temp.setZero();

    // Note: the joint is not completely built at this time.
    // Requires definition of the mask (based on concrete joint type)
}